

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memcpy.h
# Opt level: O2

int __thiscall snmalloc::X86_64Arch::copy(X86_64Arch *this,EVP_PKEY_CTX *dst,EVP_PKEY_CTX *src)

{
  undefined8 uVar1;
  uint uVar2;
  size_t dst_addr;
  EVP_PKEY_CTX *pEVar3;
  ulong uVar4;
  void *orig_dst;
  X86_64Arch *pXVar5;
  long lVar6;
  EVP_PKEY_CTX *pEVar7;
  
  uVar2 = (uint)this;
  if (src < (EVP_PKEY_CTX *)0x11) {
    switch(src) {
    case (EVP_PKEY_CTX *)0x1:
      *this = (X86_64Arch)*dst;
      return uVar2;
    case (EVP_PKEY_CTX *)0x2:
      *(undefined2 *)this = *(undefined2 *)dst;
      return uVar2;
    case (EVP_PKEY_CTX *)0x3:
      *(undefined2 *)this = *(undefined2 *)dst;
      *(EVP_PKEY_CTX *)(this + 2) = dst[2];
      return uVar2;
    case (EVP_PKEY_CTX *)0x4:
      *(undefined4 *)this = *(undefined4 *)dst;
      return uVar2;
    case (EVP_PKEY_CTX *)0x5:
      *(undefined4 *)this = *(undefined4 *)dst;
      *(EVP_PKEY_CTX *)(this + 4) = dst[4];
      return uVar2;
    case (EVP_PKEY_CTX *)0x6:
      *(undefined4 *)this = *(undefined4 *)dst;
      *(undefined2 *)(this + 4) = *(undefined2 *)(dst + 4);
      return uVar2;
    case (EVP_PKEY_CTX *)0x7:
      *(undefined4 *)this = *(undefined4 *)dst;
      *(undefined2 *)(this + 4) = *(undefined2 *)(dst + 4);
      *(EVP_PKEY_CTX *)(this + 6) = dst[6];
      return uVar2;
    case (EVP_PKEY_CTX *)0x8:
      *(undefined8 *)this = *(undefined8 *)dst;
      return uVar2;
    case (EVP_PKEY_CTX *)0x9:
      *(undefined8 *)this = *(undefined8 *)dst;
      *(EVP_PKEY_CTX *)(this + 8) = dst[8];
      return uVar2;
    case (EVP_PKEY_CTX *)0xa:
      *(undefined8 *)this = *(undefined8 *)dst;
      *(undefined2 *)(this + 8) = *(undefined2 *)(dst + 8);
      return uVar2;
    case (EVP_PKEY_CTX *)0xb:
      *(undefined8 *)this = *(undefined8 *)dst;
      *(undefined2 *)(this + 8) = *(undefined2 *)(dst + 8);
      *(EVP_PKEY_CTX *)(this + 10) = dst[10];
      return uVar2;
    case (EVP_PKEY_CTX *)0xc:
      *(undefined8 *)this = *(undefined8 *)dst;
      *(undefined4 *)(this + 8) = *(undefined4 *)(dst + 8);
      return uVar2;
    case (EVP_PKEY_CTX *)0xd:
      *(undefined8 *)this = *(undefined8 *)dst;
      *(undefined4 *)(this + 8) = *(undefined4 *)(dst + 8);
      *(EVP_PKEY_CTX *)(this + 0xc) = dst[0xc];
      return uVar2;
    case (EVP_PKEY_CTX *)0xe:
      *(undefined8 *)this = *(undefined8 *)dst;
      *(undefined4 *)(this + 8) = *(undefined4 *)(dst + 8);
      *(undefined2 *)(this + 0xc) = *(undefined2 *)(dst + 0xc);
      return uVar2;
    case (EVP_PKEY_CTX *)0xf:
      *(undefined8 *)this = *(undefined8 *)dst;
      *(undefined4 *)(this + 8) = *(undefined4 *)(dst + 8);
      *(undefined2 *)(this + 0xc) = *(undefined2 *)(dst + 0xc);
      *(EVP_PKEY_CTX *)(this + 0xe) = dst[0xe];
      return uVar2;
    case (EVP_PKEY_CTX *)0x10:
      uVar1 = *(undefined8 *)(dst + 8);
      *(undefined8 *)this = *(undefined8 *)dst;
      *(undefined8 *)(this + 8) = uVar1;
      return uVar2;
    }
  }
  else {
    if ((EVP_PKEY_CTX *)0x1ff < src) {
      uVar4 = (ulong)((uint)dst & 0x3f);
      if (uVar4 == (uVar2 & 0x3f) && ((ulong)dst & 0x3f) != 0) {
        lVar6 = 0x40 - uVar4;
        switch(uVar4) {
        case 1:
          uVar1 = *(undefined8 *)(dst + 8);
          *(undefined8 *)this = *(undefined8 *)dst;
          *(undefined8 *)(this + 8) = uVar1;
          uVar1 = *(undefined8 *)(dst + 0x18);
          *(undefined8 *)(this + 0x10) = *(undefined8 *)(dst + 0x10);
          *(undefined8 *)(this + 0x18) = uVar1;
          uVar1 = *(undefined8 *)(dst + 0x28);
          *(undefined8 *)(this + 0x20) = *(undefined8 *)(dst + 0x20);
          *(undefined8 *)(this + 0x28) = uVar1;
          *(undefined8 *)(this + 0x30) = *(undefined8 *)(dst + 0x30);
          *(undefined4 *)(this + 0x38) = *(undefined4 *)(dst + 0x38);
          *(undefined2 *)(this + 0x3c) = *(undefined2 *)(dst + 0x3c);
          *(EVP_PKEY_CTX *)(this + 0x3e) = dst[0x3e];
          break;
        case 2:
          uVar1 = *(undefined8 *)(dst + 8);
          *(undefined8 *)this = *(undefined8 *)dst;
          *(undefined8 *)(this + 8) = uVar1;
          uVar1 = *(undefined8 *)(dst + 0x18);
          *(undefined8 *)(this + 0x10) = *(undefined8 *)(dst + 0x10);
          *(undefined8 *)(this + 0x18) = uVar1;
          uVar1 = *(undefined8 *)(dst + 0x28);
          *(undefined8 *)(this + 0x20) = *(undefined8 *)(dst + 0x20);
          *(undefined8 *)(this + 0x28) = uVar1;
          *(undefined8 *)(this + 0x30) = *(undefined8 *)(dst + 0x30);
          *(undefined4 *)(this + 0x38) = *(undefined4 *)(dst + 0x38);
          *(undefined2 *)(this + 0x3c) = *(undefined2 *)(dst + 0x3c);
          break;
        case 3:
          uVar1 = *(undefined8 *)(dst + 8);
          *(undefined8 *)this = *(undefined8 *)dst;
          *(undefined8 *)(this + 8) = uVar1;
          uVar1 = *(undefined8 *)(dst + 0x18);
          *(undefined8 *)(this + 0x10) = *(undefined8 *)(dst + 0x10);
          *(undefined8 *)(this + 0x18) = uVar1;
          uVar1 = *(undefined8 *)(dst + 0x28);
          *(undefined8 *)(this + 0x20) = *(undefined8 *)(dst + 0x20);
          *(undefined8 *)(this + 0x28) = uVar1;
          *(undefined8 *)(this + 0x30) = *(undefined8 *)(dst + 0x30);
          *(undefined4 *)(this + 0x38) = *(undefined4 *)(dst + 0x38);
          *(EVP_PKEY_CTX *)(this + 0x3c) = dst[0x3c];
          break;
        case 4:
          uVar1 = *(undefined8 *)(dst + 8);
          *(undefined8 *)this = *(undefined8 *)dst;
          *(undefined8 *)(this + 8) = uVar1;
          uVar1 = *(undefined8 *)(dst + 0x18);
          *(undefined8 *)(this + 0x10) = *(undefined8 *)(dst + 0x10);
          *(undefined8 *)(this + 0x18) = uVar1;
          uVar1 = *(undefined8 *)(dst + 0x28);
          *(undefined8 *)(this + 0x20) = *(undefined8 *)(dst + 0x20);
          *(undefined8 *)(this + 0x28) = uVar1;
          *(undefined8 *)(this + 0x30) = *(undefined8 *)(dst + 0x30);
          *(undefined4 *)(this + 0x38) = *(undefined4 *)(dst + 0x38);
          break;
        case 5:
          uVar1 = *(undefined8 *)(dst + 8);
          *(undefined8 *)this = *(undefined8 *)dst;
          *(undefined8 *)(this + 8) = uVar1;
          uVar1 = *(undefined8 *)(dst + 0x18);
          *(undefined8 *)(this + 0x10) = *(undefined8 *)(dst + 0x10);
          *(undefined8 *)(this + 0x18) = uVar1;
          uVar1 = *(undefined8 *)(dst + 0x28);
          *(undefined8 *)(this + 0x20) = *(undefined8 *)(dst + 0x20);
          *(undefined8 *)(this + 0x28) = uVar1;
          *(undefined8 *)(this + 0x30) = *(undefined8 *)(dst + 0x30);
          *(undefined2 *)(this + 0x38) = *(undefined2 *)(dst + 0x38);
          *(EVP_PKEY_CTX *)(this + 0x3a) = dst[0x3a];
          break;
        case 6:
          uVar1 = *(undefined8 *)(dst + 8);
          *(undefined8 *)this = *(undefined8 *)dst;
          *(undefined8 *)(this + 8) = uVar1;
          uVar1 = *(undefined8 *)(dst + 0x18);
          *(undefined8 *)(this + 0x10) = *(undefined8 *)(dst + 0x10);
          *(undefined8 *)(this + 0x18) = uVar1;
          uVar1 = *(undefined8 *)(dst + 0x28);
          *(undefined8 *)(this + 0x20) = *(undefined8 *)(dst + 0x20);
          *(undefined8 *)(this + 0x28) = uVar1;
          *(undefined8 *)(this + 0x30) = *(undefined8 *)(dst + 0x30);
          *(undefined2 *)(this + 0x38) = *(undefined2 *)(dst + 0x38);
          break;
        case 7:
          uVar1 = *(undefined8 *)(dst + 8);
          *(undefined8 *)this = *(undefined8 *)dst;
          *(undefined8 *)(this + 8) = uVar1;
          uVar1 = *(undefined8 *)(dst + 0x18);
          *(undefined8 *)(this + 0x10) = *(undefined8 *)(dst + 0x10);
          *(undefined8 *)(this + 0x18) = uVar1;
          uVar1 = *(undefined8 *)(dst + 0x28);
          *(undefined8 *)(this + 0x20) = *(undefined8 *)(dst + 0x20);
          *(undefined8 *)(this + 0x28) = uVar1;
          *(undefined8 *)(this + 0x30) = *(undefined8 *)(dst + 0x30);
          *(EVP_PKEY_CTX *)(this + 0x38) = dst[0x38];
          break;
        case 8:
          uVar1 = *(undefined8 *)(dst + 8);
          *(undefined8 *)this = *(undefined8 *)dst;
          *(undefined8 *)(this + 8) = uVar1;
          uVar1 = *(undefined8 *)(dst + 0x18);
          *(undefined8 *)(this + 0x10) = *(undefined8 *)(dst + 0x10);
          *(undefined8 *)(this + 0x18) = uVar1;
          uVar1 = *(undefined8 *)(dst + 0x28);
          *(undefined8 *)(this + 0x20) = *(undefined8 *)(dst + 0x20);
          *(undefined8 *)(this + 0x28) = uVar1;
          *(undefined8 *)(this + 0x30) = *(undefined8 *)(dst + 0x30);
          break;
        case 9:
          uVar1 = *(undefined8 *)(dst + 8);
          *(undefined8 *)this = *(undefined8 *)dst;
          *(undefined8 *)(this + 8) = uVar1;
          uVar1 = *(undefined8 *)(dst + 0x18);
          *(undefined8 *)(this + 0x10) = *(undefined8 *)(dst + 0x10);
          *(undefined8 *)(this + 0x18) = uVar1;
          uVar1 = *(undefined8 *)(dst + 0x28);
          *(undefined8 *)(this + 0x20) = *(undefined8 *)(dst + 0x20);
          *(undefined8 *)(this + 0x28) = uVar1;
          *(undefined4 *)(this + 0x30) = *(undefined4 *)(dst + 0x30);
          *(undefined2 *)(this + 0x34) = *(undefined2 *)(dst + 0x34);
          *(EVP_PKEY_CTX *)(this + 0x36) = dst[0x36];
          break;
        case 10:
          uVar1 = *(undefined8 *)(dst + 8);
          *(undefined8 *)this = *(undefined8 *)dst;
          *(undefined8 *)(this + 8) = uVar1;
          uVar1 = *(undefined8 *)(dst + 0x18);
          *(undefined8 *)(this + 0x10) = *(undefined8 *)(dst + 0x10);
          *(undefined8 *)(this + 0x18) = uVar1;
          uVar1 = *(undefined8 *)(dst + 0x28);
          *(undefined8 *)(this + 0x20) = *(undefined8 *)(dst + 0x20);
          *(undefined8 *)(this + 0x28) = uVar1;
          *(undefined4 *)(this + 0x30) = *(undefined4 *)(dst + 0x30);
          *(undefined2 *)(this + 0x34) = *(undefined2 *)(dst + 0x34);
          break;
        case 0xb:
          uVar1 = *(undefined8 *)(dst + 8);
          *(undefined8 *)this = *(undefined8 *)dst;
          *(undefined8 *)(this + 8) = uVar1;
          uVar1 = *(undefined8 *)(dst + 0x18);
          *(undefined8 *)(this + 0x10) = *(undefined8 *)(dst + 0x10);
          *(undefined8 *)(this + 0x18) = uVar1;
          uVar1 = *(undefined8 *)(dst + 0x28);
          *(undefined8 *)(this + 0x20) = *(undefined8 *)(dst + 0x20);
          *(undefined8 *)(this + 0x28) = uVar1;
          *(undefined4 *)(this + 0x30) = *(undefined4 *)(dst + 0x30);
          *(EVP_PKEY_CTX *)(this + 0x34) = dst[0x34];
          break;
        case 0xc:
          uVar1 = *(undefined8 *)(dst + 8);
          *(undefined8 *)this = *(undefined8 *)dst;
          *(undefined8 *)(this + 8) = uVar1;
          uVar1 = *(undefined8 *)(dst + 0x18);
          *(undefined8 *)(this + 0x10) = *(undefined8 *)(dst + 0x10);
          *(undefined8 *)(this + 0x18) = uVar1;
          uVar1 = *(undefined8 *)(dst + 0x28);
          *(undefined8 *)(this + 0x20) = *(undefined8 *)(dst + 0x20);
          *(undefined8 *)(this + 0x28) = uVar1;
          *(undefined4 *)(this + 0x30) = *(undefined4 *)(dst + 0x30);
          break;
        case 0xd:
          uVar1 = *(undefined8 *)(dst + 8);
          *(undefined8 *)this = *(undefined8 *)dst;
          *(undefined8 *)(this + 8) = uVar1;
          uVar1 = *(undefined8 *)(dst + 0x18);
          *(undefined8 *)(this + 0x10) = *(undefined8 *)(dst + 0x10);
          *(undefined8 *)(this + 0x18) = uVar1;
          uVar1 = *(undefined8 *)(dst + 0x28);
          *(undefined8 *)(this + 0x20) = *(undefined8 *)(dst + 0x20);
          *(undefined8 *)(this + 0x28) = uVar1;
          *(undefined2 *)(this + 0x30) = *(undefined2 *)(dst + 0x30);
          *(EVP_PKEY_CTX *)(this + 0x32) = dst[0x32];
          break;
        case 0xe:
          uVar1 = *(undefined8 *)(dst + 8);
          *(undefined8 *)this = *(undefined8 *)dst;
          *(undefined8 *)(this + 8) = uVar1;
          uVar1 = *(undefined8 *)(dst + 0x18);
          *(undefined8 *)(this + 0x10) = *(undefined8 *)(dst + 0x10);
          *(undefined8 *)(this + 0x18) = uVar1;
          uVar1 = *(undefined8 *)(dst + 0x28);
          *(undefined8 *)(this + 0x20) = *(undefined8 *)(dst + 0x20);
          *(undefined8 *)(this + 0x28) = uVar1;
          *(undefined2 *)(this + 0x30) = *(undefined2 *)(dst + 0x30);
          break;
        case 0xf:
          uVar1 = *(undefined8 *)(dst + 8);
          *(undefined8 *)this = *(undefined8 *)dst;
          *(undefined8 *)(this + 8) = uVar1;
          uVar1 = *(undefined8 *)(dst + 0x18);
          *(undefined8 *)(this + 0x10) = *(undefined8 *)(dst + 0x10);
          *(undefined8 *)(this + 0x18) = uVar1;
          uVar1 = *(undefined8 *)(dst + 0x28);
          *(undefined8 *)(this + 0x20) = *(undefined8 *)(dst + 0x20);
          *(undefined8 *)(this + 0x28) = uVar1;
          *(EVP_PKEY_CTX *)(this + 0x30) = dst[0x30];
          break;
        case 0x10:
          uVar1 = *(undefined8 *)(dst + 8);
          *(undefined8 *)this = *(undefined8 *)dst;
          *(undefined8 *)(this + 8) = uVar1;
          uVar1 = *(undefined8 *)(dst + 0x18);
          *(undefined8 *)(this + 0x10) = *(undefined8 *)(dst + 0x10);
          *(undefined8 *)(this + 0x18) = uVar1;
          uVar1 = *(undefined8 *)(dst + 0x28);
          *(undefined8 *)(this + 0x20) = *(undefined8 *)(dst + 0x20);
          *(undefined8 *)(this + 0x28) = uVar1;
          break;
        case 0x11:
          uVar1 = *(undefined8 *)(dst + 8);
          *(undefined8 *)this = *(undefined8 *)dst;
          *(undefined8 *)(this + 8) = uVar1;
          uVar1 = *(undefined8 *)(dst + 0x18);
          *(undefined8 *)(this + 0x10) = *(undefined8 *)(dst + 0x10);
          *(undefined8 *)(this + 0x18) = uVar1;
          *(undefined8 *)(this + 0x20) = *(undefined8 *)(dst + 0x20);
          *(undefined4 *)(this + 0x28) = *(undefined4 *)(dst + 0x28);
          *(undefined2 *)(this + 0x2c) = *(undefined2 *)(dst + 0x2c);
          *(EVP_PKEY_CTX *)(this + 0x2e) = dst[0x2e];
          break;
        case 0x12:
          uVar1 = *(undefined8 *)(dst + 8);
          *(undefined8 *)this = *(undefined8 *)dst;
          *(undefined8 *)(this + 8) = uVar1;
          uVar1 = *(undefined8 *)(dst + 0x18);
          *(undefined8 *)(this + 0x10) = *(undefined8 *)(dst + 0x10);
          *(undefined8 *)(this + 0x18) = uVar1;
          *(undefined8 *)(this + 0x20) = *(undefined8 *)(dst + 0x20);
          *(undefined4 *)(this + 0x28) = *(undefined4 *)(dst + 0x28);
          *(undefined2 *)(this + 0x2c) = *(undefined2 *)(dst + 0x2c);
          break;
        case 0x13:
          uVar1 = *(undefined8 *)(dst + 8);
          *(undefined8 *)this = *(undefined8 *)dst;
          *(undefined8 *)(this + 8) = uVar1;
          uVar1 = *(undefined8 *)(dst + 0x18);
          *(undefined8 *)(this + 0x10) = *(undefined8 *)(dst + 0x10);
          *(undefined8 *)(this + 0x18) = uVar1;
          *(undefined8 *)(this + 0x20) = *(undefined8 *)(dst + 0x20);
          *(undefined4 *)(this + 0x28) = *(undefined4 *)(dst + 0x28);
          *(EVP_PKEY_CTX *)(this + 0x2c) = dst[0x2c];
          break;
        case 0x14:
          uVar1 = *(undefined8 *)(dst + 8);
          *(undefined8 *)this = *(undefined8 *)dst;
          *(undefined8 *)(this + 8) = uVar1;
          uVar1 = *(undefined8 *)(dst + 0x18);
          *(undefined8 *)(this + 0x10) = *(undefined8 *)(dst + 0x10);
          *(undefined8 *)(this + 0x18) = uVar1;
          *(undefined8 *)(this + 0x20) = *(undefined8 *)(dst + 0x20);
          *(undefined4 *)(this + 0x28) = *(undefined4 *)(dst + 0x28);
          break;
        case 0x15:
          uVar1 = *(undefined8 *)(dst + 8);
          *(undefined8 *)this = *(undefined8 *)dst;
          *(undefined8 *)(this + 8) = uVar1;
          uVar1 = *(undefined8 *)(dst + 0x18);
          *(undefined8 *)(this + 0x10) = *(undefined8 *)(dst + 0x10);
          *(undefined8 *)(this + 0x18) = uVar1;
          *(undefined8 *)(this + 0x20) = *(undefined8 *)(dst + 0x20);
          *(undefined2 *)(this + 0x28) = *(undefined2 *)(dst + 0x28);
          *(EVP_PKEY_CTX *)(this + 0x2a) = dst[0x2a];
          break;
        case 0x16:
          uVar1 = *(undefined8 *)(dst + 8);
          *(undefined8 *)this = *(undefined8 *)dst;
          *(undefined8 *)(this + 8) = uVar1;
          uVar1 = *(undefined8 *)(dst + 0x18);
          *(undefined8 *)(this + 0x10) = *(undefined8 *)(dst + 0x10);
          *(undefined8 *)(this + 0x18) = uVar1;
          *(undefined8 *)(this + 0x20) = *(undefined8 *)(dst + 0x20);
          *(undefined2 *)(this + 0x28) = *(undefined2 *)(dst + 0x28);
          break;
        case 0x17:
          uVar1 = *(undefined8 *)(dst + 8);
          *(undefined8 *)this = *(undefined8 *)dst;
          *(undefined8 *)(this + 8) = uVar1;
          uVar1 = *(undefined8 *)(dst + 0x18);
          *(undefined8 *)(this + 0x10) = *(undefined8 *)(dst + 0x10);
          *(undefined8 *)(this + 0x18) = uVar1;
          *(undefined8 *)(this + 0x20) = *(undefined8 *)(dst + 0x20);
          *(EVP_PKEY_CTX *)(this + 0x28) = dst[0x28];
          break;
        case 0x18:
          uVar1 = *(undefined8 *)(dst + 8);
          *(undefined8 *)this = *(undefined8 *)dst;
          *(undefined8 *)(this + 8) = uVar1;
          uVar1 = *(undefined8 *)(dst + 0x18);
          *(undefined8 *)(this + 0x10) = *(undefined8 *)(dst + 0x10);
          *(undefined8 *)(this + 0x18) = uVar1;
          *(undefined8 *)(this + 0x20) = *(undefined8 *)(dst + 0x20);
          break;
        case 0x19:
          uVar1 = *(undefined8 *)(dst + 8);
          *(undefined8 *)this = *(undefined8 *)dst;
          *(undefined8 *)(this + 8) = uVar1;
          uVar1 = *(undefined8 *)(dst + 0x18);
          *(undefined8 *)(this + 0x10) = *(undefined8 *)(dst + 0x10);
          *(undefined8 *)(this + 0x18) = uVar1;
          *(undefined4 *)(this + 0x20) = *(undefined4 *)(dst + 0x20);
          *(undefined2 *)(this + 0x24) = *(undefined2 *)(dst + 0x24);
          *(EVP_PKEY_CTX *)(this + 0x26) = dst[0x26];
          break;
        case 0x1a:
          uVar1 = *(undefined8 *)(dst + 8);
          *(undefined8 *)this = *(undefined8 *)dst;
          *(undefined8 *)(this + 8) = uVar1;
          uVar1 = *(undefined8 *)(dst + 0x18);
          *(undefined8 *)(this + 0x10) = *(undefined8 *)(dst + 0x10);
          *(undefined8 *)(this + 0x18) = uVar1;
          *(undefined4 *)(this + 0x20) = *(undefined4 *)(dst + 0x20);
          *(undefined2 *)(this + 0x24) = *(undefined2 *)(dst + 0x24);
          break;
        case 0x1b:
          uVar1 = *(undefined8 *)(dst + 8);
          *(undefined8 *)this = *(undefined8 *)dst;
          *(undefined8 *)(this + 8) = uVar1;
          uVar1 = *(undefined8 *)(dst + 0x18);
          *(undefined8 *)(this + 0x10) = *(undefined8 *)(dst + 0x10);
          *(undefined8 *)(this + 0x18) = uVar1;
          *(undefined4 *)(this + 0x20) = *(undefined4 *)(dst + 0x20);
          *(EVP_PKEY_CTX *)(this + 0x24) = dst[0x24];
          break;
        case 0x1c:
          uVar1 = *(undefined8 *)(dst + 8);
          *(undefined8 *)this = *(undefined8 *)dst;
          *(undefined8 *)(this + 8) = uVar1;
          uVar1 = *(undefined8 *)(dst + 0x18);
          *(undefined8 *)(this + 0x10) = *(undefined8 *)(dst + 0x10);
          *(undefined8 *)(this + 0x18) = uVar1;
          *(undefined4 *)(this + 0x20) = *(undefined4 *)(dst + 0x20);
          break;
        case 0x1d:
          uVar1 = *(undefined8 *)(dst + 8);
          *(undefined8 *)this = *(undefined8 *)dst;
          *(undefined8 *)(this + 8) = uVar1;
          uVar1 = *(undefined8 *)(dst + 0x18);
          *(undefined8 *)(this + 0x10) = *(undefined8 *)(dst + 0x10);
          *(undefined8 *)(this + 0x18) = uVar1;
          *(undefined2 *)(this + 0x20) = *(undefined2 *)(dst + 0x20);
          *(EVP_PKEY_CTX *)(this + 0x22) = dst[0x22];
          break;
        case 0x1e:
          uVar1 = *(undefined8 *)(dst + 8);
          *(undefined8 *)this = *(undefined8 *)dst;
          *(undefined8 *)(this + 8) = uVar1;
          uVar1 = *(undefined8 *)(dst + 0x18);
          *(undefined8 *)(this + 0x10) = *(undefined8 *)(dst + 0x10);
          *(undefined8 *)(this + 0x18) = uVar1;
          *(undefined2 *)(this + 0x20) = *(undefined2 *)(dst + 0x20);
          break;
        case 0x1f:
          uVar1 = *(undefined8 *)(dst + 8);
          *(undefined8 *)this = *(undefined8 *)dst;
          *(undefined8 *)(this + 8) = uVar1;
          uVar1 = *(undefined8 *)(dst + 0x18);
          *(undefined8 *)(this + 0x10) = *(undefined8 *)(dst + 0x10);
          *(undefined8 *)(this + 0x18) = uVar1;
          *(EVP_PKEY_CTX *)(this + 0x20) = dst[0x20];
          break;
        case 0x20:
          uVar1 = *(undefined8 *)(dst + 8);
          *(undefined8 *)this = *(undefined8 *)dst;
          *(undefined8 *)(this + 8) = uVar1;
          uVar1 = *(undefined8 *)(dst + 0x18);
          *(undefined8 *)(this + 0x10) = *(undefined8 *)(dst + 0x10);
          *(undefined8 *)(this + 0x18) = uVar1;
          break;
        case 0x21:
          uVar1 = *(undefined8 *)(dst + 8);
          *(undefined8 *)this = *(undefined8 *)dst;
          *(undefined8 *)(this + 8) = uVar1;
          *(undefined8 *)(this + 0x10) = *(undefined8 *)(dst + 0x10);
          *(undefined4 *)(this + 0x18) = *(undefined4 *)(dst + 0x18);
          *(undefined2 *)(this + 0x1c) = *(undefined2 *)(dst + 0x1c);
          *(EVP_PKEY_CTX *)(this + 0x1e) = dst[0x1e];
          break;
        case 0x22:
          uVar1 = *(undefined8 *)(dst + 8);
          *(undefined8 *)this = *(undefined8 *)dst;
          *(undefined8 *)(this + 8) = uVar1;
          *(undefined8 *)(this + 0x10) = *(undefined8 *)(dst + 0x10);
          *(undefined4 *)(this + 0x18) = *(undefined4 *)(dst + 0x18);
          *(undefined2 *)(this + 0x1c) = *(undefined2 *)(dst + 0x1c);
          break;
        case 0x23:
          uVar1 = *(undefined8 *)(dst + 8);
          *(undefined8 *)this = *(undefined8 *)dst;
          *(undefined8 *)(this + 8) = uVar1;
          *(undefined8 *)(this + 0x10) = *(undefined8 *)(dst + 0x10);
          *(undefined4 *)(this + 0x18) = *(undefined4 *)(dst + 0x18);
          *(EVP_PKEY_CTX *)(this + 0x1c) = dst[0x1c];
          break;
        case 0x24:
          uVar1 = *(undefined8 *)(dst + 8);
          *(undefined8 *)this = *(undefined8 *)dst;
          *(undefined8 *)(this + 8) = uVar1;
          *(undefined8 *)(this + 0x10) = *(undefined8 *)(dst + 0x10);
          *(undefined4 *)(this + 0x18) = *(undefined4 *)(dst + 0x18);
          break;
        case 0x25:
          uVar1 = *(undefined8 *)(dst + 8);
          *(undefined8 *)this = *(undefined8 *)dst;
          *(undefined8 *)(this + 8) = uVar1;
          *(undefined8 *)(this + 0x10) = *(undefined8 *)(dst + 0x10);
          *(undefined2 *)(this + 0x18) = *(undefined2 *)(dst + 0x18);
          *(EVP_PKEY_CTX *)(this + 0x1a) = dst[0x1a];
          break;
        case 0x26:
          uVar1 = *(undefined8 *)(dst + 8);
          *(undefined8 *)this = *(undefined8 *)dst;
          *(undefined8 *)(this + 8) = uVar1;
          *(undefined8 *)(this + 0x10) = *(undefined8 *)(dst + 0x10);
          *(undefined2 *)(this + 0x18) = *(undefined2 *)(dst + 0x18);
          break;
        case 0x27:
          uVar1 = *(undefined8 *)(dst + 8);
          *(undefined8 *)this = *(undefined8 *)dst;
          *(undefined8 *)(this + 8) = uVar1;
          *(undefined8 *)(this + 0x10) = *(undefined8 *)(dst + 0x10);
          *(EVP_PKEY_CTX *)(this + 0x18) = dst[0x18];
          break;
        case 0x28:
          uVar1 = *(undefined8 *)(dst + 8);
          *(undefined8 *)this = *(undefined8 *)dst;
          *(undefined8 *)(this + 8) = uVar1;
          *(undefined8 *)(this + 0x10) = *(undefined8 *)(dst + 0x10);
          break;
        case 0x29:
          uVar1 = *(undefined8 *)(dst + 8);
          *(undefined8 *)this = *(undefined8 *)dst;
          *(undefined8 *)(this + 8) = uVar1;
          *(undefined4 *)(this + 0x10) = *(undefined4 *)(dst + 0x10);
          *(undefined2 *)(this + 0x14) = *(undefined2 *)(dst + 0x14);
          *(EVP_PKEY_CTX *)(this + 0x16) = dst[0x16];
          break;
        case 0x2a:
          uVar1 = *(undefined8 *)(dst + 8);
          *(undefined8 *)this = *(undefined8 *)dst;
          *(undefined8 *)(this + 8) = uVar1;
          *(undefined4 *)(this + 0x10) = *(undefined4 *)(dst + 0x10);
          *(undefined2 *)(this + 0x14) = *(undefined2 *)(dst + 0x14);
          break;
        case 0x2b:
          uVar1 = *(undefined8 *)(dst + 8);
          *(undefined8 *)this = *(undefined8 *)dst;
          *(undefined8 *)(this + 8) = uVar1;
          *(undefined4 *)(this + 0x10) = *(undefined4 *)(dst + 0x10);
          *(EVP_PKEY_CTX *)(this + 0x14) = dst[0x14];
          break;
        case 0x2c:
          uVar1 = *(undefined8 *)(dst + 8);
          *(undefined8 *)this = *(undefined8 *)dst;
          *(undefined8 *)(this + 8) = uVar1;
          *(undefined4 *)(this + 0x10) = *(undefined4 *)(dst + 0x10);
          break;
        case 0x2d:
          uVar1 = *(undefined8 *)(dst + 8);
          *(undefined8 *)this = *(undefined8 *)dst;
          *(undefined8 *)(this + 8) = uVar1;
          *(undefined2 *)(this + 0x10) = *(undefined2 *)(dst + 0x10);
          *(EVP_PKEY_CTX *)(this + 0x12) = dst[0x12];
          break;
        case 0x2e:
          uVar1 = *(undefined8 *)(dst + 8);
          *(undefined8 *)this = *(undefined8 *)dst;
          *(undefined8 *)(this + 8) = uVar1;
          *(undefined2 *)(this + 0x10) = *(undefined2 *)(dst + 0x10);
          break;
        case 0x2f:
          uVar1 = *(undefined8 *)(dst + 8);
          *(undefined8 *)this = *(undefined8 *)dst;
          *(undefined8 *)(this + 8) = uVar1;
          *(EVP_PKEY_CTX *)(this + 0x10) = dst[0x10];
          break;
        case 0x30:
          uVar1 = *(undefined8 *)(dst + 8);
          *(undefined8 *)this = *(undefined8 *)dst;
          *(undefined8 *)(this + 8) = uVar1;
          break;
        case 0x31:
          *(undefined8 *)this = *(undefined8 *)dst;
          *(undefined4 *)(this + 8) = *(undefined4 *)(dst + 8);
          *(undefined2 *)(this + 0xc) = *(undefined2 *)(dst + 0xc);
          *(EVP_PKEY_CTX *)(this + 0xe) = dst[0xe];
          break;
        case 0x32:
          *(undefined8 *)this = *(undefined8 *)dst;
          *(undefined4 *)(this + 8) = *(undefined4 *)(dst + 8);
          *(undefined2 *)(this + 0xc) = *(undefined2 *)(dst + 0xc);
          break;
        case 0x33:
          *(undefined8 *)this = *(undefined8 *)dst;
          *(undefined4 *)(this + 8) = *(undefined4 *)(dst + 8);
          *(EVP_PKEY_CTX *)(this + 0xc) = dst[0xc];
          break;
        case 0x34:
          *(undefined8 *)this = *(undefined8 *)dst;
          *(undefined4 *)(this + 8) = *(undefined4 *)(dst + 8);
          break;
        case 0x35:
          *(undefined8 *)this = *(undefined8 *)dst;
          *(undefined2 *)(this + 8) = *(undefined2 *)(dst + 8);
          *(EVP_PKEY_CTX *)(this + 10) = dst[10];
          break;
        case 0x36:
          *(undefined8 *)this = *(undefined8 *)dst;
          *(undefined2 *)(this + 8) = *(undefined2 *)(dst + 8);
          break;
        case 0x37:
          *(undefined8 *)this = *(undefined8 *)dst;
          *(EVP_PKEY_CTX *)(this + 8) = dst[8];
          break;
        case 0x38:
          *(undefined8 *)this = *(undefined8 *)dst;
          break;
        case 0x39:
          *(undefined4 *)this = *(undefined4 *)dst;
          *(undefined2 *)(this + 4) = *(undefined2 *)(dst + 4);
          *(EVP_PKEY_CTX *)(this + 6) = dst[6];
          break;
        case 0x3a:
          *(undefined4 *)this = *(undefined4 *)dst;
          *(undefined2 *)(this + 4) = *(undefined2 *)(dst + 4);
          break;
        case 0x3b:
          *(undefined4 *)this = *(undefined4 *)dst;
          *(EVP_PKEY_CTX *)(this + 4) = dst[4];
          break;
        case 0x3c:
          *(undefined4 *)this = *(undefined4 *)dst;
          break;
        case 0x3d:
          *(undefined2 *)this = *(undefined2 *)dst;
          *(EVP_PKEY_CTX *)(this + 2) = dst[2];
          break;
        case 0x3e:
          *(undefined2 *)this = *(undefined2 *)dst;
          break;
        default:
          *this = (X86_64Arch)*dst;
        }
        dst = dst + lVar6;
        src = src + -lVar6;
        this = this + lVar6;
      }
      for (; src != (EVP_PKEY_CTX *)0x0; src = src + -1) {
        *this = (X86_64Arch)*dst;
        dst = dst + 1;
        this = (X86_64Arch *)((EVP_PKEY_CTX *)this + 1);
      }
      return uVar2;
    }
    pXVar5 = this;
    pEVar7 = dst;
    for (pEVar3 = (EVP_PKEY_CTX *)0x10; pEVar3 <= src; pEVar3 = pEVar3 + 0x10) {
      uVar1 = *(undefined8 *)(pEVar7 + 8);
      *(undefined8 *)pXVar5 = *(undefined8 *)pEVar7;
      *(undefined8 *)(pXVar5 + 8) = uVar1;
      pEVar7 = pEVar7 + 0x10;
      pXVar5 = pXVar5 + 0x10;
    }
    uVar1 = *(undefined8 *)(src + -0x10 + (long)dst + 8);
    *(undefined8 *)(src + -0x10 + (long)this) = *(undefined8 *)(src + -0x10 + (long)dst);
    *(undefined8 *)(src + -0x10 + (long)this + 8) = uVar1;
  }
  return uVar2;
}

Assistant:

static inline void* copy(void* dst, const void* src, size_t len)
    {
      auto orig_dst = dst;
      // If this is a small size, use a jump table for small sizes, like on the
      // generic architecture case above.
      if (len <= LargestRegisterSize)
      {
        small_copies<LargestRegisterSize>(dst, src, len);
      }

      // The Intel optimisation manual recommends doing this for sizes >256
      // bytes on modern systems and for all sizes on very modern systems.
      // Testing shows that this is somewhat overly optimistic.
      else if (SNMALLOC_UNLIKELY(len >= 512))
      {
        // Align to cache-line boundaries if possible.
        unaligned_start<64, LargestRegisterSize>(dst, src, len);
        // Bulk copy.  This is aggressively optimised on modern x86 cores.
#  ifdef __GNUC__
        asm volatile("rep movsb"
                     : "+S"(src), "+D"(dst), "+c"(len)
                     :
                     : "memory");
#  elif defined(_MSC_VER)
        __movsb(
          static_cast<unsigned char*>(dst),
          static_cast<const unsigned char*>(src),
          len);
#  else
#    error No inline assembly or rep movsb intrinsic for this compiler.
#  endif
      }

      // Otherwise do a simple bulk copy loop.
      else
      {
        block_copy<LargestRegisterSize>(dst, src, len);
        copy_end<LargestRegisterSize>(dst, src, len);
      }
      return orig_dst;
    }